

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

string * getCommand_abi_cxx11_(int socket_fd,pollfd *pollData,bool *msgFlags,int id)

{
  string *this;
  int iVar1;
  undefined8 *puVar2;
  _Alloc_hider _Var3;
  ssize_t sVar4;
  long lVar5;
  ulong uVar6;
  string *this_00;
  char local_1a8 [8];
  char command [256];
  size_type *local_a0;
  string cmdString;
  allocator local_31;
  
  local_a0 = &cmdString._M_string_length;
  cmdString._M_dataplus._M_p = (pointer)0x0;
  cmdString._M_string_length._0_1_ = 0;
  puVar2 = (undefined8 *)operator_new__(0x48);
  *puVar2 = 2;
  lVar5 = 0;
  do {
    *(long *)((long)puVar2 + lVar5 + 8) = (long)puVar2 + lVar5 + 0x18;
    *(undefined8 *)((long)puVar2 + lVar5 + 0x10) = 0;
    *(undefined1 *)((long)puVar2 + lVar5 + 0x18) = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  this_00 = (string *)(puVar2 + 1);
  this = (string *)(cmdString.field_2._M_local_buf + 8);
  uVar6 = 0;
  _Var3._M_p = (pointer)0x0;
LAB_001061ec:
  do {
    while( true ) {
      if (_Var3._M_p != (pointer)0x0) {
        std::__cxx11::string::find((char *)&local_a0,0x1091c9);
        std::__cxx11::string::substr((ulong)((long)&cmdString.field_2 + 8),(ulong)&local_a0);
        std::__cxx11::string::operator=
                  ((string *)this_00,(string *)(cmdString.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(cmdString.field_2._M_local_buf + 8));
        std::__cxx11::string::substr((ulong)((long)&cmdString.field_2 + 8),(ulong)&local_a0);
        std::__cxx11::string::operator=
                  ((string *)(puVar2 + 5),(string *)(cmdString.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(cmdString.field_2._M_local_buf + 8));
        goto LAB_00106357;
      }
      iVar1 = poll((pollfd *)pollData,1,500);
      if (iVar1 != 0) break;
      _Var3 = cmdString._M_dataplus;
      if (msgFlags[id] == true) {
        std::__cxx11::string::string((string *)(cmdString.field_2._M_local_buf + 8),"msg",&local_31)
        ;
        std::__cxx11::string::operator=
                  ((string *)this_00,(string *)(cmdString.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(cmdString.field_2._M_local_buf + 8));
LAB_00106357:
        std::__cxx11::string::~string((string *)&local_a0);
        return this_00;
      }
    }
    if (iVar1 != -1) {
      bzero(local_1a8,0x100);
      sVar4 = recv(socket_fd,local_1a8,0xff,0);
      if ((int)sVar4 == -1) {
        perror("recv");
        exit(1);
      }
      local_1a8[(int)sVar4] = '\0';
      std::__cxx11::string::string(this,local_1a8,&local_31);
      std::__cxx11::string::operator=((string *)&local_a0,this);
      std::__cxx11::string::~string(this);
      uVar6 = uVar6 + 1;
      _Var3 = cmdString._M_dataplus;
      if (0xf < uVar6) {
        this_00 = (string *)0x0;
        goto LAB_00106357;
      }
      goto LAB_001061ec;
    }
    perror("Error wiht polling");
    _Var3 = cmdString._M_dataplus;
  } while( true );
}

Assistant:

string* getCommand(int socket_fd, struct pollfd* pollData, bool* msgFlags, int id){

    char command[MAXDATASIZE];
    string cmdString;
    int numbytes = 0,rv = -1;
    string* returns = new string[2];


    //keep count of number of empty data recieved,
    // if more than max number was recieved, we know that the client has
    //  been disconnected
    size_t count = 0;

    while(cmdString.length() == 0){

        //check if there was something received on the socket,
        // if nothing received within .5 seconds then check if a message is
        // in the message queue
        rv = poll(pollData, 1, 500);


        if(rv == -1){
            perror("Error wiht polling");
        }
        // check if there was a time out, then check the message queue
        else if(rv == 0){
            if(msgFlags[id]){
                //propogate up that a message from another users has been receieved
                returns[0] = string("msg");
                return returns;
            }
        }
        // something was received on the socket connection
        else{
            //zero out the command just in case
            bzero(command,MAXDATASIZE);

            //get the message
            if ((numbytes = recv(socket_fd, command, MAXDATASIZE - 1, 0)) == -1) {
                perror("recv");
                exit(1);
            }

            //add null terminator to the received string
            command[numbytes] = '\0';

            //convert to c++ string
            cmdString = string(command);

            //check for the client disconnect
            count++;
            if(count > RECIEVE_MAX)
                return NULL;
        }
    }

    //finish parsing input and return
    size_t spacePos = cmdString.find(" ");
    returns[0] = cmdString.substr(0,spacePos);
    returns[1] = cmdString.substr(spacePos + 1);


    return returns;

}